

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::
iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
::iterator_base(iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
                *this,TreeIterator tree_it,InnerMap *m,size_type index)

{
  Node *pNVar1;
  LogMessage *other;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  _Base_ptr local_30;
  size_type local_28;
  size_type index_local;
  InnerMap *m_local;
  iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
  *this_local;
  TreeIterator tree_it_local;
  
  local_30 = tree_it._M_node;
  local_28 = index;
  index_local = (size_type)m;
  m_local = (InnerMap *)this;
  this_local = (iterator_base<google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
                *)tree_it._M_node;
  pNVar1 = NodeFromTreeIterator(tree_it);
  this->node_ = pNVar1;
  this->m_ = (InnerMap *)index_local;
  this->bucket_index_ = local_28;
  local_69 = 0;
  if ((this->bucket_index_ & 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x211);
    local_69 = 1;
    other = internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (bucket_index_ % 2) == (0u): ");
    internal::LogFinisher::operator=(local_7d,other);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  return;
}

Assistant:

iterator_base(TreeIterator tree_it, const InnerMap* m, size_type index)
          : node_(NodeFromTreeIterator(tree_it)), m_(m), bucket_index_(index) {
        // Invariant: iterators that use buckets with trees have an even
        // bucket_index_.
        GOOGLE_DCHECK_EQ(bucket_index_ % 2, 0u);
      }